

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_init
                   (TT_SBitDecoder decoder,TT_Face face,FT_ULong strike_index,
                   TT_SBit_MetricsRec *metrics)

{
  FT_Stream stream_00;
  FT_Byte *pFVar1;
  ulong uVar2;
  FT_Byte *p;
  FT_Stream stream;
  FT_Error error;
  TT_SBit_MetricsRec *metrics_local;
  FT_ULong strike_index_local;
  TT_Face face_local;
  TT_SBitDecoder decoder_local;
  
  stream._4_4_ = 0x8e;
  stream_00 = (face->root).stream;
  uVar2 = (ulong)face->sbit_strike_map[strike_index];
  if ((face->ebdt_size != 0) &&
     (stream._4_4_ = FT_Stream_Seek(stream_00,face->ebdt_start), stream._4_4_ == 0)) {
    decoder->face = face;
    decoder->stream = stream_00;
    decoder->bitmap = &((face->root).glyph)->bitmap;
    decoder->metrics = metrics;
    decoder->metrics_loaded = '\0';
    decoder->bitmap_allocated = '\0';
    decoder->ebdt_start = face->ebdt_start;
    decoder->ebdt_size = face->ebdt_size;
    decoder->eblc_base = face->sbit_table;
    decoder->eblc_limit = face->sbit_table + face->sbit_table_size;
    if (face->sbit_table_size < uVar2 * 0x30 + 0x37) {
      stream._4_4_ = 3;
    }
    else {
      pFVar1 = decoder->eblc_base;
      decoder->strike_index_array =
           (ulong)((uint)pFVar1[uVar2 * 0x30 + 8] << 0x18 | (uint)pFVar1[uVar2 * 0x30 + 9] << 0x10 |
                   (uint)pFVar1[uVar2 * 0x30 + 10] << 8 | (uint)pFVar1[uVar2 * 0x30 + 0xb]);
      decoder->strike_index_count =
           (ulong)((uint)pFVar1[uVar2 * 0x30 + 0x10] << 0x18 |
                   (uint)pFVar1[uVar2 * 0x30 + 0x11] << 0x10 |
                   (uint)pFVar1[uVar2 * 0x30 + 0x12] << 8 | (uint)pFVar1[uVar2 * 0x30 + 0x13]);
      decoder->bit_depth = pFVar1[uVar2 * 0x30 + 0x36];
      if ((face->sbit_table_size < decoder->strike_index_array) ||
         (face->sbit_table_size - decoder->strike_index_array >> 3 < decoder->strike_index_count)) {
        stream._4_4_ = 3;
      }
    }
  }
  return stream._4_4_;
}

Assistant:

static FT_Error
  tt_sbit_decoder_init( TT_SBitDecoder       decoder,
                        TT_Face              face,
                        FT_ULong             strike_index,
                        TT_SBit_MetricsRec*  metrics )
  {
    FT_Error   error  = FT_ERR( Table_Missing );
    FT_Stream  stream = face->root.stream;


    strike_index = face->sbit_strike_map[strike_index];

    if ( !face->ebdt_size )
      goto Exit;
    if ( FT_STREAM_SEEK( face->ebdt_start ) )
      goto Exit;

    decoder->face    = face;
    decoder->stream  = stream;
    decoder->bitmap  = &face->root.glyph->bitmap;
    decoder->metrics = metrics;

    decoder->metrics_loaded   = 0;
    decoder->bitmap_allocated = 0;

    decoder->ebdt_start = face->ebdt_start;
    decoder->ebdt_size  = face->ebdt_size;

    decoder->eblc_base  = face->sbit_table;
    decoder->eblc_limit = face->sbit_table + face->sbit_table_size;

    /* now find the strike corresponding to the index */
    {
      FT_Byte*  p;


      if ( 8 + 48 * strike_index + 3 * 4 + 34 + 1 > face->sbit_table_size )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      p = decoder->eblc_base + 8 + 48 * strike_index;

      decoder->strike_index_array = FT_NEXT_ULONG( p );
      p                          += 4;
      decoder->strike_index_count = FT_NEXT_ULONG( p );
      p                          += 34;
      decoder->bit_depth          = *p;

      /* decoder->strike_index_array +                               */
      /*   8 * decoder->strike_index_count > face->sbit_table_size ? */
      if ( decoder->strike_index_array > face->sbit_table_size           ||
           decoder->strike_index_count >
             ( face->sbit_table_size - decoder->strike_index_array ) / 8 )
        error = FT_THROW( Invalid_File_Format );
    }

  Exit:
    return error;
  }